

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O2

int run_test_handle_fileno(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_4c0;
  uv_os_fd_t fd;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tty_t tty;
  uv_tcp_t tcp;
  uv_pipe_t pipe;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar1 = uv_idle_init(puVar2,&idle);
    if (iVar1 == 0) {
      iVar1 = uv_fileno((uv_handle_t *)&idle,&fd);
      if (iVar1 == -0x16) {
        uv_close((uv_handle_t *)&idle,(uv_close_cb)0x0);
        iVar1 = uv_tcp_init(puVar2,&tcp);
        if (iVar1 == 0) {
          iVar1 = uv_fileno((uv_handle_t *)&tcp,&fd);
          if (iVar1 == -9) {
            iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&addr,0);
            if (iVar1 == 0) {
              iVar1 = uv_fileno((uv_handle_t *)&tcp,&fd);
              if (iVar1 == 0) {
                uv_close((uv_handle_t *)&tcp,(uv_close_cb)0x0);
                iVar1 = uv_fileno((uv_handle_t *)&tcp,&fd);
                if (iVar1 == -9) {
                  iVar1 = uv_udp_init(puVar2,&udp);
                  if (iVar1 == 0) {
                    iVar1 = uv_fileno((uv_handle_t *)&udp,&fd);
                    if (iVar1 == -9) {
                      iVar1 = uv_udp_bind(&udp,(sockaddr *)&addr,0);
                      if (iVar1 == 0) {
                        iVar1 = uv_fileno((uv_handle_t *)&udp,&fd);
                        if (iVar1 == 0) {
                          uv_close((uv_handle_t *)&udp,(uv_close_cb)0x0);
                          iVar1 = uv_fileno((uv_handle_t *)&udp,&fd);
                          if (iVar1 == -9) {
                            iVar1 = uv_pipe_init(puVar2,&pipe,0);
                            if (iVar1 == 0) {
                              iVar1 = uv_fileno((uv_handle_t *)&pipe,&fd);
                              if (iVar1 == -9) {
                                iVar1 = uv_pipe_bind(&pipe,"/tmp/uv-test-sock");
                                if (iVar1 == 0) {
                                  iVar1 = uv_fileno((uv_handle_t *)&pipe,&fd);
                                  if (iVar1 == 0) {
                                    uv_close((uv_handle_t *)&pipe,(uv_close_cb)0x0);
                                    iVar1 = uv_fileno((uv_handle_t *)&pipe,&fd);
                                    if (iVar1 == -9) {
                                      iVar1 = open64("/dev/tty",0,0);
                                      if (iVar1 < 0) {
                                        fwrite("Cannot open a TTY fd",0x14,1,_stderr);
                                        fflush(_stderr);
                                      }
                                      else {
                                        iVar1 = uv_tty_init(puVar2,&tty,iVar1,0);
                                        if (iVar1 != 0) {
                                          pcVar3 = "r == 0";
                                          uStack_4c0 = 0x6d;
                                          goto LAB_0012ee79;
                                        }
                                        iVar1 = uv_is_readable((uv_stream_t *)&tty);
                                        if (iVar1 == 0) {
                                          pcVar3 = "uv_is_readable((uv_stream_t*) &tty)";
                                          uStack_4c0 = 0x6e;
                                          goto LAB_0012ee79;
                                        }
                                        iVar1 = uv_is_writable((uv_stream_t *)&tty);
                                        if (iVar1 != 0) {
                                          pcVar3 = "!uv_is_writable((uv_stream_t*) &tty)";
                                          uStack_4c0 = 0x6f;
                                          goto LAB_0012ee79;
                                        }
                                        iVar1 = uv_fileno((uv_handle_t *)&tty,&fd);
                                        if (iVar1 != 0) {
                                          pcVar3 = "r == 0";
                                          uStack_4c0 = 0x71;
                                          goto LAB_0012ee79;
                                        }
                                        uv_close((uv_handle_t *)&tty,(uv_close_cb)0x0);
                                        iVar1 = uv_fileno((uv_handle_t *)&tty,&fd);
                                        if (iVar1 != -9) {
                                          pcVar3 = "r == UV_EBADF";
                                          uStack_4c0 = 0x74;
                                          goto LAB_0012ee79;
                                        }
                                        iVar1 = uv_is_readable((uv_stream_t *)&tty);
                                        if (iVar1 != 0) {
                                          pcVar3 = "!uv_is_readable((uv_stream_t*) &tty)";
                                          uStack_4c0 = 0x75;
                                          goto LAB_0012ee79;
                                        }
                                        iVar1 = uv_is_writable((uv_stream_t *)&tty);
                                        if (iVar1 != 0) {
                                          pcVar3 = "!uv_is_writable((uv_stream_t*) &tty)";
                                          uStack_4c0 = 0x76;
                                          goto LAB_0012ee79;
                                        }
                                      }
                                      uv_run(puVar2,UV_RUN_DEFAULT);
                                      puVar2 = uv_default_loop();
                                      uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                      uv_run(puVar2,UV_RUN_DEFAULT);
                                      puVar2 = uv_default_loop();
                                      iVar1 = uv_loop_close(puVar2);
                                      if (iVar1 == 0) {
                                        return 0;
                                      }
                                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                                      uStack_4c0 = 0x7b;
                                    }
                                    else {
                                      pcVar3 = "r == UV_EBADF";
                                      uStack_4c0 = 0x65;
                                    }
                                  }
                                  else {
                                    pcVar3 = "r == 0";
                                    uStack_4c0 = 0x62;
                                  }
                                }
                                else {
                                  pcVar3 = "r == 0";
                                  uStack_4c0 = 0x60;
                                }
                              }
                              else {
                                pcVar3 = "r == UV_EBADF";
                                uStack_4c0 = 0x5e;
                              }
                            }
                            else {
                              pcVar3 = "r == 0";
                              uStack_4c0 = 0x5c;
                            }
                          }
                          else {
                            pcVar3 = "r == UV_EBADF";
                            uStack_4c0 = 0x59;
                          }
                        }
                        else {
                          pcVar3 = "r == 0";
                          uStack_4c0 = 0x56;
                        }
                      }
                      else {
                        pcVar3 = "r == 0";
                        uStack_4c0 = 0x54;
                      }
                    }
                    else {
                      pcVar3 = "r == UV_EBADF";
                      uStack_4c0 = 0x52;
                    }
                  }
                  else {
                    pcVar3 = "r == 0";
                    uStack_4c0 = 0x50;
                  }
                }
                else {
                  pcVar3 = "r == UV_EBADF";
                  uStack_4c0 = 0x4d;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_4c0 = 0x4a;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_4c0 = 0x48;
            }
          }
          else {
            pcVar3 = "r == UV_EBADF";
            uStack_4c0 = 0x46;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_4c0 = 0x44;
        }
      }
      else {
        pcVar3 = "r == UV_EINVAL";
        uStack_4c0 = 0x40;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_4c0 = 0x3e;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_4c0 = 0x3b;
  }
LAB_0012ee79:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-handle-fileno.c"
          ,uStack_4c0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  int tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT(r == UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd < 0) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT(r == 0);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}